

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O1

KString * __thiscall
KDIS::PDU::Fire_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Fire_PDU *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_240;
  long *local_220;
  long local_218;
  long local_210 [2];
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-Fire PDU-\n",0xb);
  Warfare_Header::GetAsString_abi_cxx11_(&local_1e0,&this->super_Warfare_Header);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Fire Mission Index:  ",0x15);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"World Location:      ",0x15);
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_200,&this->m_Location);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  (*(((this->m_pDescriptor).m_pRef)->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_220);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_220,local_218);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Velocity:            ",0x15);
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_240,&this->m_Velocity);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Range:               ",0x15);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32Range);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Fire_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Fire PDU-\n"
       << Warfare_Header::GetAsString()
       << "Fire Mission Index:  " << m_ui32FireMissionIndex  << "\n"
       << "World Location:      " << m_Location.GetAsString()
       << m_pDescriptor->GetAsString()
       << "Velocity:            " << m_Velocity.GetAsString()
       << "Range:               " << m_f32Range             << "\n";

    return ss.str();
}